

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void anim_full(Sprite *spr,float *lval,float start_val,float end_val,Interp func,float delay,
              float duration)

{
  Anim *pAVar1;
  Interp in_EDX;
  float *in_RSI;
  Sprite *in_RDI;
  float in_XMM0_Da;
  float start_time_00;
  double dVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Anim *anim;
  float start_time;
  
  dVar2 = (double)al_get_time();
  start_time_00 = (float)(dVar2 + (double)in_XMM2_Da);
  fix_conflicting_anims(in_RDI,in_RSI,start_time_00,in_XMM0_Da);
  pAVar1 = get_next_anim(in_RDI);
  pAVar1->lval = in_RSI;
  pAVar1->start_val = in_XMM0_Da;
  pAVar1->end_val = in_XMM1_Da;
  pAVar1->func = in_EDX;
  pAVar1->start_time = start_time_00;
  pAVar1->end_time = start_time_00 + in_XMM3_Da;
  return;
}

Assistant:

static void anim_full(Sprite *spr, float *lval, float start_val, float end_val,
   Interp func, float delay, float duration)
{
   float start_time;
   Anim *anim;

   start_time = al_get_time() + delay;
   fix_conflicting_anims(spr, lval, start_time, start_val);

   anim = get_next_anim(spr);
   anim->lval = lval;
   anim->start_val = start_val;
   anim->end_val = end_val;
   anim->func = func;
   anim->start_time = start_time;
   anim->end_time = start_time + duration;
}